

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  CustomRect *rect;
  ImFont **ppIVar1;
  long in_RDI;
  ImFont *unaff_retaddr;
  int i_1;
  ImVec2 uv1;
  ImVec2 uv0;
  CustomRect *r;
  int i;
  int local_2c;
  float in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  float in_stack_ffffffffffffffe0;
  float in_stack_ffffffffffffffe4;
  float in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  float y0;
  
  ImFontAtlasBuildRenderDefaultTexData
            ((ImFontAtlas *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  for (y0 = 0.0; (int)y0 < *(int *)(in_RDI + 0x50); y0 = (float)((int)y0 + 1)) {
    rect = ImVector<ImFontAtlas::CustomRect>::operator[]
                     ((ImVector<ImFontAtlas::CustomRect> *)(in_RDI + 0x50),(int)y0);
    if ((rect->Font != (ImFont *)0x0) && (rect->ID < 0x10001)) {
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffe0);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd8);
      ImFontAtlas::CalcCustomRectUV
                ((ImFontAtlas *)CONCAT44(y0,in_stack_fffffffffffffff0),rect,
                 (ImVec2 *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 (ImVec2 *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      ImFont::AddGlyph(unaff_retaddr,(ImWchar)((ulong)in_RDI >> 0x30),(float)in_RDI,y0,
                       in_stack_fffffffffffffff0,(float)((ulong)rect >> 0x20),SUB84(rect,0),
                       in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc
                       ,uv1.x);
    }
  }
  for (local_2c = 0; local_2c < *(int *)(in_RDI + 0x40); local_2c = local_2c + 1) {
    ppIVar1 = ImVector<ImFont_*>::operator[]((ImVector<ImFont_*> *)(in_RDI + 0x40),local_2c);
    if (((*ppIVar1)->DirtyLookupTables & 1U) != 0) {
      ImVector<ImFont_*>::operator[]((ImVector<ImFont_*> *)(in_RDI + 0x40),local_2c);
      ImFont::BuildLookupTable((ImFont *)CONCAT44(uv1.y,uv1.x));
    }
  }
  return;
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data block
    ImFontAtlasBuildRenderDefaultTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlas::CustomRect& r = atlas->CustomRects[i];
        if (r.Font == NULL || r.ID > 0x10000)
            continue;

        IM_ASSERT(r.Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(&r, &uv0, &uv1);
        r.Font->AddGlyph((ImWchar)r.ID, r.GlyphOffset.x, r.GlyphOffset.y, r.GlyphOffset.x + r.Width, r.GlyphOffset.y + r.Height, uv0.x, uv0.y, uv1.x, uv1.y, r.GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();
}